

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

unsigned_long flatbuffers::HashFnv1<unsigned_long>(char *input)

{
  byte bVar1;
  ulong uVar2;
  char *c;
  byte *pbVar3;
  
  uVar2 = 0xcbf29ce484222645;
  bVar1 = *input;
  if (bVar1 != 0) {
    pbVar3 = (byte *)(input + 1);
    do {
      uVar2 = (ulong)bVar1 ^ uVar2 * 0x100000001b3;
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    return uVar2;
  }
  return 0xcbf29ce484222645;
}

Assistant:

T HashFnv1(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash *= FnvTraits<T>::kFnvPrime;
    hash ^= static_cast<unsigned char>(*c);
  }
  return hash;
}